

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O3

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  char *__s;
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  size_t sVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = ProcessOperator(this,(shared_ptr<const_calc4::Operator> *)
                               (((op->
                                 super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->left).
                               super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
  iVar2 = ProcessOperator(this,(shared_ptr<const_calc4::Operator> *)
                               (((op->
                                 super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->right).
                               super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
  __s = (&PTR_anon_var_dwarf_70775_0014aca8)
        [(int)((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->type];
  AppendVariableDeclarationBegin(this);
  poVar3 = this->os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"var_",4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  uStack_38._0_3_ = CONCAT12(0x20,(undefined2)uStack_38);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_38 + 2),1);
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  uStack_38._0_4_ = CONCAT13(0x20,(undefined3)uStack_38);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_38 + 3),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"var_",4);
  std::ostream::operator<<(poVar3,iVar2);
  if (((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      type - Equal < 6) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os," ? 1 : 0",8);
  }
  AppendVariableDeclarationEnd((Visitor<__int128> *)this->os);
  uStack_38 = CONCAT44(this->lastVariableNo,(undefined4)uStack_38);
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->stack).c,(int *)((long)&uStack_38 + 4));
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        int left = ProcessOperator(op->GetLeft());
        int right = ProcessOperator(op->GetRight());

        const char* operatorChar;
        switch (op->GetType())
        {
        case BinaryType::Add:
            operatorChar = "+";
            break;
        case BinaryType::Sub:
            operatorChar = "-";
            break;
        case BinaryType::Mult:
            operatorChar = "*";
            break;
        case BinaryType::Div:
            operatorChar = "/";
            break;
        case BinaryType::Mod:
            operatorChar = "%";
            break;
        case BinaryType::Equal:
            operatorChar = "==";
            break;
        case BinaryType::NotEqual:
            operatorChar = "!=";
            break;
        case BinaryType::LessThan:
            operatorChar = "<";
            break;
        case BinaryType::LessThanOrEqual:
            operatorChar = "<=";
            break;
        case BinaryType::GreaterThanOrEqual:
            operatorChar = ">=";
            break;
        case BinaryType::GreaterThan:
            operatorChar = ">";
            break;
        default:
            UNREACHABLE();
            break;
        }

        AppendVariableDeclarationBegin();
        os << VariableName(left) << ' ' << operatorChar << ' ' << VariableName(right);
        switch (op->GetType())
        {
        case BinaryType::Equal:
        case BinaryType::NotEqual:
        case BinaryType::LessThan:
        case BinaryType::LessThanOrEqual:
        case BinaryType::GreaterThanOrEqual:
        case BinaryType::GreaterThan:
            os << " ? 1 : 0";
            break;
        default:
            break;
        }
        AppendVariableDeclarationEnd();
        Return();
    }